

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall HoldingProperty_MoveOwner_Test::TestBody(HoldingProperty_MoveOwner_Test *this)

{
  int iVar1;
  char *pcVar2;
  AssertHelper local_60;
  AssertHelper local_58;
  AssertionResult gtest_ar_4;
  HoldingMovableType obj2;
  int remembered_value;
  HoldingMovableType obj;
  
  HoldingMovableType::HoldingMovableType(&obj);
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen;
  remembered_value = (int)obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 3;
  UNLOCK();
  gtest_ar_4._0_4_ = iVar1 + 1;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&obj2,"remembered_value","copy_to.value1().getId()",&remembered_value,
             (int *)&gtest_ar_4);
  if ((char)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                 obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id) == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                                  obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x25b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&obj2.ro_value);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  local_60.data_._0_4_ = (int)obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&obj2,"0","obj.value1().getId()",(int *)&gtest_ar_4,(int *)&local_60);
  if ((char)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                 obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id) == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                                  obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x25c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&obj2.ro_value);
  gtest_ar_4._0_4_ = obj.value1;
  obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(ValueType)0x0;
  obj.value2.super_PropertyHoldingBase<Movable>.m_value.m_id = (PropertyHoldingBase<Movable>)0x0;
  obj.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id = (PropertyHoldingBase<Movable>)0x0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&obj2,"remembered_value","move_to.value1().getId()",&remembered_value,
             (int *)&gtest_ar_4);
  if ((char)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                 obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id) == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                                  obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x25f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&obj2.ro_value);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  local_60.data_._0_4_ = (int)obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&obj2,"0","obj.value1().getId()",(int *)&gtest_ar_4,(int *)&local_60);
  if ((char)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                 obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id) == (undefined8 *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT44(obj2.value3.super_PropertyHoldingBase<IdHolder>.m_value.id,
                                  obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x260,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&obj2.ro_value);
  HoldingMovableType::HoldingMovableType(&obj2);
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen;
  remembered_value = (int)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 3;
  UNLOCK();
  local_60.data_._0_4_ = iVar1 + 1;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar_4,"remembered_value","copy_to.value1().getId()",&remembered_value
             ,(int *)&local_60);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_60.data_._0_4_ = 0;
  local_58.data_._0_4_ = (int)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar_4,"0","obj2.value1().getId()",(int *)&local_60,(int *)&local_58);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x267,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_60.data_._0_4_ = (int)obj2.value1;
  obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(ValueType)0x0;
  obj2.value2.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(ValueType)0x0;
  obj2.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(ValueType)0x0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"remembered_value","move_to.value1().getId()",&remembered_value
             ,(int *)&local_60);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_60.data_._0_4_ = 0;
  local_58.data_._0_4_ = (int)obj2.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"0","obj2.value1().getId()",(int *)&local_60,(int *)&local_58);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  return;
}

Assistant:

TEST(HoldingProperty, MoveOwner)
{
  HoldingMovableType obj;

  auto remembered_value = obj.value1().getId();
  HoldingMovableType copy_to{ obj };
  EXPECT_NE( remembered_value, copy_to.value1().getId() );
  EXPECT_NE( 0, obj.value1().getId() );
  
  HoldingMovableType move_to{ std::move( obj ) };
  EXPECT_EQ( remembered_value, move_to.value1().getId() );
  EXPECT_EQ( 0, obj.value1().getId() );
  
  HoldingMovableType obj2;
  
  remembered_value = obj2.value1().getId();
  copy_to = obj2;
  EXPECT_NE( remembered_value, copy_to.value1().getId() );
  EXPECT_NE( 0, obj2.value1().getId() );
  
  move_to = std::move( obj2 );
  EXPECT_EQ( remembered_value, move_to.value1().getId() );
  EXPECT_EQ( 0, obj2.value1().getId() );
}